

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::~IfcPile(IfcPile *this)

{
  *(undefined8 *)&this[-1].field_0x70 = 0x90b060;
  *(undefined8 *)&this->field_0x58 = 0x90b178;
  *(undefined8 *)&this[-1].field_0xf8 = 0x90b088;
  *(undefined8 *)&this[-1].field_0x108 = 0x90b0b0;
  *(undefined8 *)&this[-1].field_0x140 = 0x90b0d8;
  *(undefined8 *)&this[-1].field_0x170 = 0x90b100;
  *(undefined8 *)&this[-1].field_0x1a8 = 0x90b128;
  *(undefined8 *)this = 0x90b150;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x70,&PTR_construction_vtable_24__0090b198);
  operator_delete(&this[-1].field_0x70);
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}